

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O1

Mat * __thiscall
FlickerRemoverCPU::removeFlickering
          (FlickerRemoverCPU *this,Mat *frame,double timestamp,string *error)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  Size **ppSVar4;
  BooleanArray2D **ppBVar5;
  uint uVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  Mat *pMVar10;
  _InputArray *p_Var11;
  Range RVar12;
  ulong uVar13;
  Range *pRVar14;
  undefined8 uVar15;
  uint uVar16;
  Size *pSVar17;
  long *plVar18;
  ulong *puVar19;
  Size SVar20;
  Size SVar21;
  Size SVar22;
  Size SVar23;
  undefined8 uVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  uint uVar26;
  Mat *frame_copy;
  string __str_2;
  string __str_1;
  string __str_3;
  string __str;
  _InputArray local_1c8;
  undefined1 *puStack_1b0;
  Range local_1a8;
  Range local_1a0;
  _InputArray local_198;
  Range RStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _OutputArray local_138;
  long lStack_120;
  Size *local_118;
  long local_110;
  Size local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  Size *local_98;
  long local_90;
  Size local_88 [2];
  string *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if ((*(int *)(frame + 8) != this->frame_rows) || (*(int *)(frame + 0xc) != this->frame_cols)) {
    uVar2 = *(uint *)(frame + 0xc);
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar26 = 1;
    if (9 < uVar3) {
      uVar13 = (ulong)uVar3;
      uVar6 = 4;
      do {
        uVar26 = uVar6;
        uVar16 = (uint)uVar13;
        if (uVar16 < 100) {
          uVar26 = uVar26 - 2;
          goto LAB_00112757;
        }
        if (uVar16 < 1000) {
          uVar26 = uVar26 - 1;
          goto LAB_00112757;
        }
        if (uVar16 < 10000) goto LAB_00112757;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar26 + 4;
      } while (99999 < uVar16);
      uVar26 = uVar26 + 1;
    }
LAB_00112757:
    local_70[0] = &local_60;
    local_78 = error;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar26 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_70[0]->_M_local_buf + (uVar2 >> 0x1f),uVar26,uVar3);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x117bfe);
    plVar18 = plVar8 + 2;
    if ((long *)*plVar8 == plVar18) {
      local_40 = *plVar18;
      lStack_38 = plVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar18;
      local_50 = (long *)*plVar8;
    }
    local_48 = plVar8[1];
    *plVar8 = (long)plVar18;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d8 = &local_c8;
    puVar19 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar19) {
      local_c8 = *puVar19;
      lStack_c0 = plVar8[3];
    }
    else {
      local_c8 = *puVar19;
      local_d8 = (ulong *)*plVar8;
    }
    local_d0 = plVar8[1];
    *plVar8 = (long)puVar19;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar2 = *(uint *)(frame + 8);
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar26 = 1;
    if (9 < uVar3) {
      uVar13 = (ulong)uVar3;
      uVar6 = 4;
      do {
        uVar26 = uVar6;
        uVar16 = (uint)uVar13;
        if (uVar16 < 100) {
          uVar26 = uVar26 - 2;
          goto LAB_001128c5;
        }
        if (uVar16 < 1000) {
          uVar26 = uVar26 - 1;
          goto LAB_001128c5;
        }
        if (uVar16 < 10000) goto LAB_001128c5;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar26 + 4;
      } while (99999 < uVar16);
      uVar26 = uVar26 + 1;
    }
LAB_001128c5:
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar26 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_f8),uVar26,uVar3);
    uVar13 = 0xf;
    if (local_d8 != &local_c8) {
      uVar13 = local_c8;
    }
    if (uVar13 < (ulong)(local_f0 + local_d0)) {
      uVar13 = 0xf;
      if (local_f8 != local_e8) {
        uVar13 = local_e8[0];
      }
      if (uVar13 < (ulong)(local_f0 + local_d0)) goto LAB_0011295f;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_0011295f:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8);
    }
    local_b8 = &local_a8;
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_a8 = *plVar8;
      uStack_a0 = puVar9[3];
    }
    else {
      local_a8 = *plVar8;
      local_b8 = (long *)*puVar9;
    }
    local_b0 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar25) {
      local_178.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_178.field_2._8_8_ = plVar8[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_178._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_178._M_string_length = plVar8[1];
    *plVar8 = (long)paVar25;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar2 = this->frame_cols;
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar26 = 1;
    if (9 < uVar3) {
      uVar13 = (ulong)uVar3;
      uVar6 = 4;
      do {
        uVar26 = uVar6;
        uVar16 = (uint)uVar13;
        if (uVar16 < 100) {
          uVar26 = uVar26 - 2;
          goto LAB_00112a9b;
        }
        if (uVar16 < 1000) {
          uVar26 = uVar26 - 1;
          goto LAB_00112a9b;
        }
        if (uVar16 < 10000) goto LAB_00112a9b;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar26 + 4;
      } while (99999 < uVar16);
      uVar26 = uVar26 + 1;
    }
LAB_00112a9b:
    local_118 = local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar26 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&local_118->width + (ulong)(uVar2 >> 0x1f)),uVar26,uVar3);
    uVar15._0_4_ = 0xf;
    uVar15._4_4_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      uVar15 = local_178.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_110 + local_178._M_string_length) {
      SVar20.width = 0xf;
      SVar20.height = 0;
      if (local_118 != local_108) {
        SVar20 = local_108[0];
      }
      if ((ulong)SVar20 < local_110 + local_178._M_string_length) goto LAB_00112b29;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_118,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
    }
    else {
LAB_00112b29:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_118);
    }
    local_158._0_8_ = local_158 + 0x10;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar25) {
      local_148._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_148._8_8_ = puVar9[3];
    }
    else {
      local_148._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_158._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_158._8_8_ = puVar9[1];
    *puVar9 = paVar25;
    puVar9[1] = 0;
    paVar25->_M_local_buf[0] = '\0';
    plVar8 = (long *)std::__cxx11::string::append(local_158);
    ppSVar4 = (Size **)&local_138.super__InputArray.sz;
    pSVar17 = (Size *)(plVar8 + 2);
    if ((Size *)*plVar8 == pSVar17) {
      local_138.super__InputArray.sz = *pSVar17;
      lStack_120 = plVar8[3];
      local_138.super__InputArray._0_8_ = ppSVar4;
    }
    else {
      local_138.super__InputArray.sz = *pSVar17;
      local_138.super__InputArray._0_8_ = (Size *)*plVar8;
    }
    local_138.super__InputArray.obj = (void *)plVar8[1];
    *plVar8 = (long)pSVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar2 = this->frame_rows;
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar26 = 1;
    if (9 < uVar3) {
      uVar13 = (ulong)uVar3;
      uVar6 = 4;
      do {
        uVar26 = uVar6;
        uVar16 = (uint)uVar13;
        if (uVar16 < 100) {
          uVar26 = uVar26 - 2;
          goto LAB_00112c65;
        }
        if (uVar16 < 1000) {
          uVar26 = uVar26 - 1;
          goto LAB_00112c65;
        }
        if (uVar16 < 10000) goto LAB_00112c65;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar26 + 4;
      } while (99999 < uVar16);
      uVar26 = uVar26 + 1;
    }
LAB_00112c65:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar26 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&local_98->width + (ulong)(uVar2 >> 0x1f)),uVar26,uVar3);
    SVar21.width = 0xf;
    SVar21.height = 0;
    if ((Size **)local_138.super__InputArray._0_8_ != ppSVar4) {
      SVar21 = local_138.super__InputArray.sz;
    }
    if ((ulong)SVar21 < (ulong)(local_90 + (long)local_138.super__InputArray.obj)) {
      SVar22.width = 0xf;
      SVar22.height = 0;
      if (local_98 != local_88) {
        SVar22 = local_88[0];
      }
      if ((ulong)SVar22 < (ulong)(local_90 + (long)local_138.super__InputArray.obj))
      goto LAB_00112cee;
      pRVar14 = (Range *)std::__cxx11::string::replace
                                   ((ulong)&local_98,0,(char *)0x0,local_138.super__InputArray._0_8_
                                   );
    }
    else {
LAB_00112cee:
      pRVar14 = (Range *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98);
    }
    local_198._0_8_ = &local_198.sz;
    RVar12 = (Range)(pRVar14 + 2);
    if (*pRVar14 == RVar12) {
      local_198.sz = *(Size *)RVar12;
      RStack_180 = pRVar14[3];
    }
    else {
      local_198.sz = *(Size *)RVar12;
      local_198._0_8_ = *pRVar14;
    }
    local_198.obj = *(void **)(pRVar14 + 1);
    *pRVar14 = RVar12;
    pRVar14[1].start = 0;
    pRVar14[1].end = 0;
    *(undefined1 *)RVar12 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
    pSVar17 = (Size *)(plVar8 + 2);
    if ((Size *)*plVar8 == pSVar17) {
      local_1c8.sz = *pSVar17;
      puStack_1b0 = (undefined1 *)plVar8[3];
      local_1c8._0_8_ = &local_1c8.sz;
    }
    else {
      local_1c8.sz = *pSVar17;
      local_1c8._0_8_ = (Size *)*plVar8;
    }
    local_1c8.obj = (void *)plVar8[1];
    *plVar8 = (long)pSVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_1c8);
    if ((Size *)local_1c8._0_8_ != &local_1c8.sz) {
      operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1c8.sz + 1));
    }
    if ((Size *)local_198._0_8_ != &local_198.sz) {
      operator_delete((void *)local_198._0_8_,(ulong)((long)local_198.sz + 1));
    }
    if (local_98 != local_88) {
      operator_delete(local_98,(ulong)((long)local_88[0] + 1));
    }
    if ((Size **)local_138.super__InputArray._0_8_ != ppSVar4) {
      operator_delete((void *)local_138.super__InputArray._0_8_,
                      (ulong)((long)local_138.super__InputArray.sz + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_148._M_allocated_capacity + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,(ulong)((long)local_108[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      (ulong)(local_178.field_2._M_allocated_capacity + 1));
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    paVar25 = local_70[0];
    if (local_70[0] == &local_60) {
      return (Mat *)0x0;
    }
LAB_00112f3a:
    operator_delete(paVar25,local_60._M_allocated_capacity + 1);
    return (Mat *)0x0;
  }
  dVar1 = this->expected_timestamp;
  if (((dVar1 != -1.0) || (NAN(dVar1))) &&
     (this->accepted_timestamp_difference <= ABS(dVar1 - timestamp))) {
    if (timestamp < dVar1) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 vsnprintf,0x148,"%f");
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x117c4e);
      ppSVar4 = (Size **)&local_138.super__InputArray.sz;
      pSVar17 = (Size *)(plVar8 + 2);
      if ((Size *)*plVar8 == pSVar17) {
        local_138.super__InputArray.sz = *pSVar17;
        lStack_120 = plVar8[3];
        local_138.super__InputArray._0_8_ = ppSVar4;
      }
      else {
        local_138.super__InputArray.sz = *pSVar17;
        local_138.super__InputArray._0_8_ = (Size *)*plVar8;
      }
      local_138.super__InputArray.obj = (void *)plVar8[1];
      *plVar8 = (long)pSVar17;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pRVar14 = (Range *)std::__cxx11::string::append((char *)&local_138);
      ppBVar5 = (BooleanArray2D **)&local_198.sz;
      RVar12 = (Range)(pRVar14 + 2);
      if (*pRVar14 == RVar12) {
        local_198.sz = *(Size *)RVar12;
        RStack_180 = pRVar14[3];
        local_198._0_8_ = ppBVar5;
      }
      else {
        local_198.sz = *(Size *)RVar12;
        local_198._0_8_ = *pRVar14;
      }
      local_198.obj = *(void **)(pRVar14 + 1);
      *pRVar14 = RVar12;
      pRVar14[1].start = 0;
      pRVar14[1].end = 0;
      *(undefined1 *)&pRVar14[2].start = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_178,vsnprintf,0x148,"%f",this->expected_timestamp);
      SVar23.width = 0xf;
      SVar23.height = 0;
      if ((BooleanArray2D **)local_198._0_8_ != ppBVar5) {
        SVar23 = local_198.sz;
      }
      if ((ulong)SVar23 < local_178._M_string_length + (long)local_198.obj) {
        uVar24._0_4_ = 0xf;
        uVar24._4_4_ = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          uVar24 = local_178.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_178._M_string_length + (long)local_198.obj) goto LAB_0011340c;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_178,0,(char *)0x0,local_198._0_8_);
      }
      else {
LAB_0011340c:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_198,(ulong)local_178._M_dataplus._M_p);
      }
      local_1c8._0_8_ = &local_1c8.sz;
      pSVar17 = (Size *)(plVar8 + 2);
      if ((Size *)*plVar8 == pSVar17) {
        local_1c8.sz = *pSVar17;
        puStack_1b0 = (undefined1 *)plVar8[3];
      }
      else {
        local_1c8.sz = *pSVar17;
        local_1c8._0_8_ = (Size *)*plVar8;
      }
      local_1c8.obj = (void *)plVar8[1];
      *plVar8 = (long)pSVar17;
      plVar8[1] = 0;
      *(undefined1 *)&pSVar17->width = 0;
      std::__cxx11::string::operator=((string *)error,(string *)&local_1c8);
      if ((Size *)local_1c8._0_8_ != &local_1c8.sz) {
        operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1c8.sz + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        (ulong)(local_178.field_2._M_allocated_capacity + 1));
      }
      if ((BooleanArray2D **)local_198._0_8_ != ppBVar5) {
        operator_delete((void *)local_198._0_8_,(ulong)((long)local_198.sz + 1));
      }
      if ((Size **)local_138.super__InputArray._0_8_ != ppSVar4) {
        operator_delete((void *)local_138.super__InputArray._0_8_,
                        (ulong)((long)local_138.super__InputArray.sz + 1));
      }
      local_60._M_allocated_capacity = local_148._M_allocated_capacity;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_158 + 0x10)) {
        return (Mat *)0x0;
      }
      goto LAB_00112f3a;
    }
    this->actual_mask =
         ((int)(long)(((timestamp - dVar1) + this->accepted_timestamp_difference) /
                     this->timestamps_delta) + this->actual_mask) % (this->number_of_masks + 1);
    this->expected_timestamp = timestamp;
  }
  this->expected_timestamp = timestamp + this->timestamps_delta;
  pMVar10 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(pMVar10);
  local_158._0_8_ = pMVar10;
  if (this->actual_mask == this->number_of_masks) {
    this->actual_mask = 0;
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = 0x2010000;
    local_1c8.obj = pMVar10;
    cv::Mat::convertTo((_OutputArray *)frame,(int)&local_1c8,1.0,0.0);
  }
  else {
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = 0x1010000;
    local_198.obj =
         (this->masks).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
         super__Vector_impl_data._M_start + (ulong)this->actual_mask * 0x60;
    local_198.sz.width = 0;
    local_198.sz.height = 0;
    local_198.flags = 0x1010000;
    local_138.super__InputArray.sz.width = 0;
    local_138.super__InputArray.sz.height = 0;
    local_138.super__InputArray.flags = 0x2010000;
    local_1c8.obj = frame;
    local_138.super__InputArray.obj = pMVar10;
    p_Var11 = (_InputArray *)cv::noArray();
    cv::subtract(&local_1c8,&local_198,&local_138,p_Var11,4);
    this->actual_mask = this->actual_mask + 1;
  }
  if ((this->frames_block).count_of_elements == 0) {
    pMVar10 = (Mat *)0x0;
  }
  else {
    pMVar10 = (this->frames_block).data[(this->frames_block).last_element_index];
  }
  if (pMVar10 == (Mat *)0x0) {
LAB_0011315a:
    pMVar10 = CircularBuffer<cv::Mat_*>::push(&this->frames_block,(Mat *)local_158._0_8_);
    if (pMVar10 != (Mat *)0x0) {
      frame = (Mat *)operator_new(0x10);
      BooleanArray2D::BooleanArray2D((BooleanArray2D *)frame,this->frame_rows,this->frame_cols);
      RVar12 = (Range)CircularBuffer<BooleanArray2D_*>::push
                                (&this->corresponding_frames_similarity_levels,
                                 (BooleanArray2D *)frame);
      cVar7 = cv::Mat::empty();
      if (cVar7 != '\0') goto LAB_00113590;
      uVar13 = cv::Mat::total();
      if (uVar13 / (ulong)(long)*(int *)(*(long *)(pMVar10 + 0x40) + -4 +
                                        (long)*(int *)(pMVar10 + 4) * 4) < 0x80000000) {
        uVar13 = cv::Mat::total();
        local_198._0_8_ =
             uVar13 / (ulong)(long)*(int *)(*(long *)(pMVar10 + 0x40) + -4 +
                                           (long)*(int *)(pMVar10 + 4) * 4) << 0x20;
        local_1c8._0_8_ = &PTR__ParallelLoopBody_0011e958;
        puStack_1b0 = local_158;
        local_1c8.obj = pMVar10;
        local_1c8.sz = (Size)this;
        local_1a8 = (Range)frame;
        local_1a0 = RVar12;
        cv::parallel_for_((Range *)&local_198,(ParallelLoopBody *)&local_1c8,-1.0);
        cv::ParallelLoopBody::~ParallelLoopBody((ParallelLoopBody *)&local_1c8);
        if (RVar12 != (Range)0x0) {
          BooleanArray2D::~BooleanArray2D((BooleanArray2D *)RVar12);
          operator_delete((void *)RVar12,0x10);
        }
        goto LAB_00113258;
      }
      goto LAB_001135d4;
    }
LAB_00113258:
    if ((this->actual_mask != this->number_of_masks) ||
       ((this->frames_block).count_of_elements != (this->frames_block).count_of_slots)) {
      return (Mat *)local_158._0_8_;
    }
    cVar7 = cv::Mat::empty();
    if (cVar7 == '\0') {
      uVar13 = cv::Mat::total();
      if (uVar13 / (ulong)(long)*(int *)(*(long *)&this->field_0x1a0 + -4 +
                                        (long)*(int *)&this->field_0x164 * 4) < 0x80000000) {
        uVar13 = cv::Mat::total();
        local_198._0_8_ =
             uVar13 / (ulong)(long)*(int *)(*(long *)&this->field_0x1a0 + -4 +
                                           (long)*(int *)&this->field_0x164 * 4) << 0x20;
        local_1c8._0_8_ = &PTR__ParallelLoopBody_0011e998;
        puStack_1b0 = local_158;
        local_1c8.obj = &this->flicker_counter;
        local_1c8.sz = (Size)this;
        cv::parallel_for_((Range *)&local_198,(ParallelLoopBody *)&local_1c8,-1.0);
        cv::ParallelLoopBody::~ParallelLoopBody((ParallelLoopBody *)&local_1c8);
        return (Mat *)local_158._0_8_;
      }
      goto LAB_00113658;
    }
  }
  else {
    RVar12 = (Range)operator_new(0x10);
    BooleanArray2D::BooleanArray2D((BooleanArray2D *)RVar12,this->frame_rows,this->frame_cols);
    frame = (Mat *)CircularBuffer<BooleanArray2D_*>::push
                             (&this->adjacent_frames_similarity_levels,(BooleanArray2D *)RVar12);
    cVar7 = cv::Mat::empty();
    if (cVar7 == '\0') {
      uVar13 = cv::Mat::total();
      if (uVar13 / (ulong)(long)*(int *)(*(long *)(pMVar10 + 0x40) + -4 +
                                        (long)*(int *)(pMVar10 + 4) * 4) < 0x80000000) {
        uVar13 = cv::Mat::total();
        local_198._0_8_ =
             uVar13 / (ulong)(long)*(int *)(*(long *)(pMVar10 + 0x40) + -4 +
                                           (long)*(int *)(pMVar10 + 4) * 4) << 0x20;
        local_1c8._0_8_ = &PTR__ParallelLoopBody_0011e918;
        puStack_1b0 = local_158;
        local_1c8.obj = pMVar10;
        local_1c8.sz = (Size)this;
        local_1a8 = RVar12;
        local_1a0 = (Range)frame;
        cv::parallel_for_((Range *)&local_198,(ParallelLoopBody *)&local_1c8,-1.0);
        cv::ParallelLoopBody::~ParallelLoopBody((ParallelLoopBody *)&local_1c8);
        if ((Range)frame != (Range)0x0) {
          BooleanArray2D::~BooleanArray2D((BooleanArray2D *)frame);
          operator_delete(frame,0x10);
        }
        goto LAB_0011315a;
      }
    }
    else {
      local_1c8._0_8_ = &local_1c8.sz;
      local_1c8.sz.width = 0x706d6521;
      local_1c8.sz.height = 0x29287974;
      local_1c8.obj = (Mat *)0x8;
      puStack_1b0 = (undefined1 *)((ulong)puStack_1b0 & 0xffffffffffffff00);
      cv::error(-0xd7,(string *)&local_1c8,"forEach_impl",
                "/usr/include/opencv4/opencv2/core/utility.hpp",0x273);
    }
    local_1c8._0_8_ = &local_1c8.sz;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"this->total() / this->size[this->dims - 1] <= INT_MAX","");
    cv::error(-0xd7,(string *)&local_1c8,"forEach_impl",
              "/usr/include/opencv4/opencv2/core/utility.hpp",0x274);
LAB_00113590:
    local_1c8._0_8_ = &local_1c8.sz;
    local_1c8.sz.width = 0x706d6521;
    local_1c8.sz.height = 0x29287974;
    local_1c8.obj = (Mat *)0x8;
    puStack_1b0 = (undefined1 *)((ulong)puStack_1b0 & 0xffffffffffffff00);
    cv::error(-0xd7,(string *)&local_1c8,"forEach_impl",
              "/usr/include/opencv4/opencv2/core/utility.hpp",0x273);
LAB_001135d4:
    local_1c8._0_8_ = &local_1c8.sz;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"this->total() / this->size[this->dims - 1] <= INT_MAX","");
    cv::error(-0xd7,(string *)&local_1c8,"forEach_impl",
              "/usr/include/opencv4/opencv2/core/utility.hpp",0x274);
  }
  local_1c8._0_8_ = &local_1c8.sz;
  local_1c8.sz.width = 0x706d6521;
  local_1c8.sz.height = 0x29287974;
  local_1c8.obj = (Mat *)0x8;
  puStack_1b0 = (undefined1 *)((ulong)puStack_1b0 & 0xffffffffffffff00);
  cv::error(-0xd7,(string *)&local_1c8,"forEach_impl",
            "/usr/include/opencv4/opencv2/core/utility.hpp",0x273);
LAB_00113658:
  local_1c8._0_8_ = &local_1c8.sz;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"this->total() / this->size[this->dims - 1] <= INT_MAX","");
  uVar15 = cv::error(-0xd7,(string *)&local_1c8,"forEach_impl",
                     "/usr/include/opencv4/opencv2/core/utility.hpp",0x274);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,(ulong)(local_178.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((Mat *)local_198._0_8_ != frame) {
    operator_delete((void *)local_198._0_8_,(long)local_198.sz + 1);
  }
  if ((Size *)local_138.super__InputArray._0_8_ != &local_1c8.sz) {
    operator_delete((void *)local_138.super__InputArray._0_8_,
                    (long)local_138.super__InputArray.sz + 1);
  }
  if ((Mat *)local_158._0_8_ != (Mat *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_148._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar15);
}

Assistant:

Mat *FlickerRemoverCPU::removeFlickering(const Mat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new Mat();

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_32S);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_32S);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_similarity_levels = new BooleanArray2D((unsigned int) frame_rows, (unsigned int) frame_cols);
        auto old_similarity_levels = adjacent_frames_similarity_levels.push(new_similarity_levels);

        last_frame->forEach<int>(
                [this, &frame_copy, new_similarity_levels, old_similarity_levels](int &value, const int *position) {
                    int row = position[0];
                    int col = position[1];
                    bool pixels_are_similar = similar(value, frame_copy->at<int>(row, col));
                    new_similarity_levels->set((unsigned int) row, (unsigned int) col, pixels_are_similar);
                    adjacent_frames_similarity_sum.at<unsigned char>(row, col) +=
                            (unsigned char) pixels_are_similar -
                            (unsigned char) old_similarity_levels->at((unsigned int) row, (unsigned int) col);
                });
        delete old_similarity_levels;
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new BooleanArray2D((unsigned int) frame_rows, (unsigned int) frame_cols);
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);
        prev_frame->forEach<int>(
                [this, &frame_copy, new_similarity_levels, old_similarity_levels](int &value, const int *position) {
                    int row = position[0];
                    int col = position[1];
                    bool pixels_are_similar = similar(value, frame_copy->at<int>(row, col));
                    new_similarity_levels->set((unsigned int) row, (unsigned int) col, pixels_are_similar);
                    corresponding_frames_similarity_sum.at<unsigned char>(row, col) +=
                            (unsigned char) pixels_are_similar -
                            (unsigned char) old_similarity_levels->at((unsigned int) row, (unsigned int) col);
                });
        delete old_similarity_levels;
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        flicker_counter.forEach<unsigned char>([this, &frame_copy](unsigned char &value, const int *position) {
            int row = position[0];
            int col = position[1];
            if(corresponding_frames_similarity_sum.at<unsigned char>(row, col) > 0.7 * block_size) {
                bool values_similar = true;
                unsigned int block_number = 0;
                while(values_similar && block_number + 1 < frames_block.maxSize()) {
                    values_similar = similar(frames_block[(int) block_number]->at<int>(row, col),
                                             frames_block[(int) block_number + 1]->at<int>(row, col));
                    block_number++;
                }
                if(!values_similar) {
                    value++;
                } else {
                    value = 0;
                }
            } else {
                value = 0;
            }
            if(value > max_allowed_flicker_duration) {
                for(int i = 0; i < (int) number_of_masks; i++) {
                    masks[i].at<int>(row, col) +=
                            frames_block[i + 1]->at<int>(row, col) - frames_block[0]->at<int>(row, col);
                }
                value = 0;
                //subtract mask from frame copy, but be sure that result is between 0-255
                auto mask_val = masks[number_of_masks - 1].at<int>(row, col);
                auto &frame_copy_val = frame_copy->at<int>(row, col);
                if(mask_val >= 0) {
                    if(frame_copy_val >= mask_val) {
                        frame_copy_val -= mask_val;
                    } else {
                        frame_copy_val = 0;
                    }
                } else {
                    if((int) frame_copy_val - mask_val > 255) {
                        frame_copy_val = 255;
                    } else {
                        frame_copy_val -= mask_val;
                    }
                }
            }
        });
    }
    return frame_copy;
}